

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_read_journal_header(Pager *pPager,sxu32 *pNRec,pgno *pDbSize)

{
  int iVar1;
  sxi32 sVar2;
  long lStack_48;
  int rc;
  sxi64 iSize;
  sxi64 iHdrOfft;
  uchar zMagic [8];
  sxu32 iSectorSize;
  sxu32 iPageSize;
  pgno *pDbSize_local;
  sxu32 *pNRec_local;
  Pager *pPager_local;
  
  iSize = 0;
  iVar1 = unqliteOsFileSize(pPager->pjfd,&stack0xffffffffffffffb8);
  if (iVar1 == 0) {
    if (lStack_48 < 0x20) {
      pPager_local._4_4_ = -0x1c;
    }
    else {
      pPager_local._4_4_ = unqliteOsRead(pPager->pjfd,&iHdrOfft,8,iSize);
      if (pPager_local._4_4_ == 0) {
        sVar2 = SyMemcmp(&iHdrOfft,aJournalMagic,8);
        if (sVar2 == 0) {
          iSize = iSize + 8;
          pPager_local._4_4_ = ReadInt32(pPager->pjfd,pNRec,iSize);
          if (pPager_local._4_4_ == 0) {
            iSize = iSize + 4;
            pPager_local._4_4_ = ReadInt32(pPager->pjfd,&pPager->cksumInit,iSize);
            if (pPager_local._4_4_ == 0) {
              iSize = iSize + 4;
              pPager_local._4_4_ = ReadInt64(pPager->pjfd,pDbSize,iSize);
              if (pPager_local._4_4_ == 0) {
                iSize = iSize + 8;
                pPager_local._4_4_ = ReadInt32(pPager->pjfd,(sxu32 *)zMagic,iSize);
                if (pPager_local._4_4_ == 0) {
                  iSize = iSize + 4;
                  pPager_local._4_4_ = ReadInt32(pPager->pjfd,(sxu32 *)(zMagic + 4),iSize);
                  if (pPager_local._4_4_ == 0) {
                    if (((((uint)zMagic._4_4_ < 0x200) || ((uint)zMagic._0_4_ < 0x20)) ||
                        (0x10000 < (uint)zMagic._4_4_)) ||
                       (((0x10000 < (uint)zMagic._0_4_ || ((zMagic._4_4_ - 1 & zMagic._4_4_) != 0))
                        || ((zMagic._0_4_ - 1 & zMagic._0_4_) != 0)))) {
                      pPager_local._4_4_ = -0x1c;
                    }
                    else {
                      pPager->iSectorSize = zMagic._0_4_;
                      pPager->iPageSize = zMagic._4_4_;
                      pPager->iJournalOfft = (long)pPager->iSectorSize;
                      pPager_local._4_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          pPager_local._4_4_ = -0x1c;
        }
      }
    }
  }
  else {
    pPager_local._4_4_ = -0x1c;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_read_journal_header(
  Pager *pPager,               /* Pager object */
  sxu32 *pNRec,                /* OUT: Value read from the nRec field */
  pgno  *pDbSize               /* OUT: Value of original database size field */
)
{
	sxu32 iPageSize,iSectorSize;
	unsigned char zMagic[8];
	sxi64 iHdrOfft;
	sxi64 iSize;
	int rc;
	/* Offset to start reading from */
	iHdrOfft = 0;
	/* Get the size of the journal */
	rc = unqliteOsFileSize(pPager->pjfd,&iSize);
	if( rc != UNQLITE_OK ){
		return UNQLITE_DONE;
	}
	/* If the journal file is too small, return UNQLITE_DONE. */
	if( 32 /* Minimum sector size */> iSize ){
		return UNQLITE_DONE;
	}
	/* Make sure we are dealing with a valid journal */
	rc = unqliteOsRead(pPager->pjfd,zMagic,sizeof(zMagic),iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( SyMemcmp(zMagic,aJournalMagic,sizeof(zMagic)) != 0 ){
		return UNQLITE_DONE;
	}
	iHdrOfft += sizeof(zMagic);
	 /* Read the first three 32-bit fields of the journal header: The nRec
      ** field, the checksum-initializer and the database size at the start
      ** of the transaction. Return an error code if anything goes wrong.
      */
	rc = ReadInt32(pPager->pjfd,pNRec,iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iHdrOfft += 4;
	rc = ReadInt32(pPager->pjfd,&pPager->cksumInit,iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iHdrOfft += 4;
	rc = ReadInt64(pPager->pjfd,pDbSize,iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iHdrOfft += 8;
	/* Read the page-size and sector-size journal header fields. */
	rc = ReadInt32(pPager->pjfd,&iSectorSize,iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	iHdrOfft += 4;
	rc = ReadInt32(pPager->pjfd,&iPageSize,iHdrOfft);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( iPageSize < UNQLITE_MIN_PAGE_SIZE || iSectorSize<32
     || iPageSize > UNQLITE_MAX_PAGE_SIZE || iSectorSize>MAX_SECTOR_SIZE
     || ((iPageSize-1)&iPageSize)!=0    || ((iSectorSize-1)&iSectorSize)!=0 
    ){
      /* If the either the page-size or sector-size in the journal-header is 
      ** invalid, then the process that wrote the journal-header must have 
      ** crashed before the header was synced. In this case stop reading 
      ** the journal file here.
      */
      return UNQLITE_DONE;
    }
    /* Update the assumed sector-size to match the value used by 
    ** the process that created this journal. If this journal was
    ** created by a process other than this one, then this routine
    ** is being called from within pager_playback(). The local value
    ** of Pager.sectorSize is restored at the end of that routine.
    */
    pPager->iSectorSize = iSectorSize;
	pPager->iPageSize = iPageSize;
	/* Ready to rollback */
	pPager->iJournalOfft = JOURNAL_HDR_SZ(pPager);
	/* All done */
	return UNQLITE_OK;
}